

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O0

LargeStackBlock<Js::StringCopyInfo> *
LargeStackBlock<Js::StringCopyInfo>::Make(ArenaAllocator *alloc,int itemCount)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  StringCopyInfo *pSVar2;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  LargeStackBlock<Js::StringCopyInfo> *local_20;
  LargeStackBlock<Js::StringCopyInfo> *block;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAStack_10;
  int itemCount_local;
  ArenaAllocator *alloc_local;
  
  block._4_4_ = itemCount;
  pAStack_10 = &alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/LargeStack.h"
             ,0xc);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(&alloc->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                          &local_48);
  local_58 = Memory::ArenaAllocator::Alloc;
  local_50 = 0;
  local_20 = (LargeStackBlock<Js::StringCopyInfo> *)
             new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar1,0x3f67b0);
  pAVar1 = pAStack_10;
  local_20->itemCount = block._4_4_;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&Js::StringCopyInfo::typeinfo,0,(long)block._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/LargeStack.h"
             ,0xe);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_80);
  pSVar2 = Memory::AllocateArray<Memory::ArenaAllocator,Js::StringCopyInfo,false>
                     ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (long)block._4_4_);
  local_20->items = pSVar2;
  local_20->index = 0;
  return local_20;
}

Assistant:

static LargeStackBlock<T>* Make(ArenaAllocator* alloc,int itemCount) {
        LargeStackBlock<T>* block = AnewStruct(alloc, LargeStackBlock<T>);
        block->itemCount=itemCount;
        block->items = AnewArray(alloc, T, itemCount);
        block->index=0;
        return block;
    }